

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

IDiagObjectAddress * __thiscall
Js::CatchScopeWalker::FindPropertyAddress(CatchScopeWalker *this,PropertyId _propId,bool *isConst)

{
  Type *pTVar1;
  int i;
  int index;
  IDiagObjectAddress *local_38;
  IDiagObjectAddress *address;
  Type properties;
  
  *isConst = false;
  local_38 = (IDiagObjectAddress *)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr((WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                     *)&address,&this->debuggerScope->scopeProperties);
  index = 0;
  while( true ) {
    if (*(int *)&address[2]._vptr_IDiagObjectAddress <= index) {
      return (IDiagObjectAddress *)0x0;
    }
    pTVar1 = JsUtil::
             List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)address,index);
    if (pTVar1->propId == _propId) break;
    index = index + 1;
  }
  pTVar1 = JsUtil::
           List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)address,index);
  FetchValueAndAddress(this,pTVar1,(Var *)0x0,&local_38);
  return local_38;
}

Assistant:

IDiagObjectAddress *CatchScopeWalker::FindPropertyAddress(PropertyId _propId, bool& isConst)
    {
        isConst = false;
        IDiagObjectAddress * address = nullptr;
        auto properties = debuggerScope->scopeProperties;
        for (int i = 0; i < properties->Count(); i++)
        {
            if (properties->Item(i).propId == _propId)
            {
                FetchValueAndAddress(properties->Item(i), nullptr, &address);
                break;
            }
        }

        return address;
    }